

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O3

void __thiscall
chrono::robosimian::RS_Limb::Activate(RS_Limb *this,double time,array<double,_8UL> *vals)

{
  element_type *peVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  mapped_type *pmVar3;
  long lVar4;
  undefined1 *__k;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  __k = motor_names_abi_cxx11_;
  lVar4 = 0;
  do {
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chrono::ChLinkMotorRotation>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->m_motors,(key_type *)__k);
    peVar1 = (pmVar3->super___shared_ptr<chrono::ChLinkMotorRotation,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    plVar2 = *(long **)(peVar1 + 0x250);
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar1 + 600);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
        if (__libc_single_threaded != '\0') goto LAB_00143663;
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
LAB_00143663:
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    auVar6._8_8_ = 0;
    auVar6._0_8_ = vals->_M_elems[lVar4];
    auVar5._8_8_ = 0x8000000000000000;
    auVar5._0_8_ = 0x8000000000000000;
    auVar5 = vxorpd_avx512vl(auVar6,auVar5);
    (**(code **)(*plVar2 + 0xd0))(auVar5._0_8_,time,plVar2);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    lVar4 = lVar4 + 1;
    __k = (undefined1 *)((long)__k + 0x20);
    if (lVar4 == 8) {
      return;
    }
  } while( true );
}

Assistant:

void RS_Limb::Activate(double time, const std::array<double, 8>& vals) {
    for (int i = 0; i < 8; i++) {
        auto fun = std::static_pointer_cast<ChFunction_Setpoint>(m_motors[motor_names[i]]->GetMotorFunction());
        fun->SetSetpoint(-vals[i], time);
    }
}